

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scomplex.c
# Opt level: O0

singlecomplex c_sqrt(singlecomplex *z)

{
  float fVar1;
  float fVar2;
  singlecomplex sVar3;
  double dVar4;
  float imag;
  float real;
  float ci;
  float cr;
  singlecomplex *z_local;
  singlecomplex retval;
  
  fVar1 = z->r;
  fVar2 = z->i;
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    dVar4 = sqrt((double)(fVar1 * fVar1 + fVar2 * fVar2));
    dVar4 = sqrt((double)(float)((dVar4 - (double)fVar1) / 2.0));
    z_local._4_4_ = (float)dVar4;
    z_local._0_4_ = fVar2 / (z_local._4_4_ * 2.0);
  }
  else {
    dVar4 = sqrt((double)fVar1);
    z_local._0_4_ = (float)dVar4;
    z_local._4_4_ = 0.0;
  }
  sVar3.i = z_local._4_4_;
  sVar3.r = z_local._0_4_;
  return sVar3;
}

Assistant:

singlecomplex c_sqrt(singlecomplex *z)
{
    singlecomplex retval;
    register float cr, ci, real, imag;

    real = z->r;
    imag = z->i;

    if ( imag == 0.0 ) {
        retval.r = sqrt(real);
        retval.i = 0.0;
    } else {
        ci = (sqrt(real*real + imag*imag) - real) / 2.0;
        ci = sqrt(ci);
        cr = imag / (2.0 * ci);
        retval.r = cr;
        retval.i = ci;
    }

    return retval;
}